

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,3,1,-1,3>>::
resizeLike<Eigen::Matrix<float,_1,3,1,_1,3>>
          (PlainObjectBase<Eigen::Matrix<float,_1,3,1,_1,3>> *this,
          EigenBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *_other)

{
  bool bVar1;
  PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *this_00;
  Index IVar2;
  Index IVar3;
  Index othersize;
  Matrix<float,__1,_3,_1,__1,_3> *other;
  EigenBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *_other_local;
  PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *this_local;
  bool error;
  long max_index;
  
  this_00 = &EigenBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::derived(_other)->
             super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>;
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::rows(this_00);
  IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::cols(this_00);
  if ((IVar2 == 0) || (IVar3 == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = 0x7fffffffffffffff / IVar3 < IVar2;
  }
  if (bVar1) {
    internal::throw_std_bad_alloc();
  }
  PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::rows(this_00);
  PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::cols(this_00);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::rows(this_00);
  IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::cols(this_00);
  PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *)this,IVar2,IVar3);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }